

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue(AsciiParser *this,uint32_t type_id,Value *result)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t tyid_03;
  uint32_t tyid_04;
  uint32_t tyid_05;
  uint32_t tyid_06;
  uint32_t tyid_07;
  uint32_t tyid_08;
  uint32_t tyid_09;
  uint32_t tyid_10;
  uint32_t tyid_11;
  uint32_t tyid_12;
  uint32_t tyid_13;
  uint32_t tyid_14;
  uint32_t tyid_15;
  uint32_t tyid_16;
  uint32_t tyid_17;
  uint32_t tyid_18;
  uint32_t tyid_19;
  uint32_t tyid_20;
  uint32_t tyid_21;
  uint32_t tyid_22;
  uint32_t tyid_23;
  uint32_t tyid_24;
  uint32_t tyid_25;
  uint32_t tyid_26;
  uint32_t tyid_27;
  uint32_t tyid_28;
  uint32_t tyid_29;
  uint32_t tyid_30;
  uint32_t tyid_31;
  uint32_t tyid_32;
  uint32_t tyid_33;
  uint32_t tyid_34;
  uint32_t tyid_35;
  uint32_t tyid_36;
  uint32_t tyid_37;
  uint32_t tyid_38;
  uint32_t tyid_39;
  uint32_t tyid_40;
  string local_5a60;
  string local_5a40;
  string local_5a20 [32];
  ostringstream local_5a00 [8];
  ostringstream ss_e_41;
  Value local_5888;
  string local_5870;
  string local_5850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5810;
  ostringstream local_57f0 [8];
  ostringstream ss_e_40;
  undefined1 local_5678 [8];
  matrix4d typed_val_40;
  string local_55e0;
  string local_55c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_55a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5580;
  ostringstream local_5560 [8];
  ostringstream ss_e_39;
  undefined1 local_53e8 [8];
  matrix3d typed_val_39;
  string local_5388;
  string local_5368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5328;
  ostringstream local_5308 [8];
  ostringstream ss_e_38;
  undefined1 local_5190 [8];
  matrix2d typed_val_38;
  string local_5158;
  string local_5138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50f8;
  ostringstream local_50d8 [8];
  ostringstream ss_e_37;
  undefined1 local_4f60 [8];
  matrix4f typed_val_37;
  string local_4f08;
  string local_4ee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ea8;
  ostringstream local_4e88 [8];
  ostringstream ss_e_36;
  undefined1 local_4d0c [8];
  matrix3f typed_val_36;
  string local_4cd0;
  string local_4cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c70;
  ostringstream local_4c50 [8];
  ostringstream ss_e_35;
  undefined1 local_4ad8 [8];
  matrix2f typed_val_35;
  string local_4ab0;
  string local_4a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a50;
  ostringstream local_4a30 [8];
  ostringstream ss_e_34;
  undefined1 local_48b4 [8];
  texcoord3f typed_val_34;
  string local_4890;
  string local_4870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4830;
  ostringstream local_4810 [8];
  ostringstream ss_e_33;
  texcoord2f local_4698;
  texcoord2f typed_val_33;
  string local_4678;
  string local_4658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4618;
  ostringstream local_45f8 [8];
  ostringstream ss_e_32;
  undefined1 local_447c [8];
  point3f typed_val_32;
  string local_4458;
  string local_4438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_43f8;
  ostringstream local_43d8 [8];
  ostringstream ss_e_31;
  undefined1 local_425c [8];
  normal3f typed_val_31;
  string local_4238;
  string local_4218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_41d8;
  ostringstream local_41b8 [8];
  ostringstream ss_e_30;
  undefined1 local_403c [8];
  vector3f typed_val_30;
  string local_4018;
  string local_3ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3fb8;
  ostringstream local_3f98 [8];
  ostringstream ss_e_29;
  undefined1 local_3e20 [8];
  color4d typed_val_29;
  string local_3de8;
  string local_3dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d88;
  ostringstream local_3d68 [8];
  ostringstream ss_e_28;
  undefined1 local_3bf0 [8];
  color3d typed_val_28;
  string local_3bc0;
  string local_3ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b60;
  ostringstream local_3b40 [8];
  ostringstream ss_e_27;
  undefined1 local_39c8 [8];
  color4f typed_val_27;
  string local_39a0;
  string local_3980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3940;
  ostringstream local_3920 [8];
  ostringstream ss_e_26;
  undefined1 local_37a4 [8];
  color3f typed_val_26;
  string local_3780;
  string local_3760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3720;
  ostringstream local_3700 [8];
  ostringstream ss_e_25;
  undefined1 local_3588 [8];
  quatd typed_val_25;
  string local_3550;
  string local_3530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_34f0;
  ostringstream local_34d0 [8];
  ostringstream ss_e_24;
  undefined1 local_3358 [8];
  quatf typed_val_24;
  string local_3330;
  string local_3310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_32f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_32d0;
  ostringstream local_32b0 [8];
  ostringstream ss_e_23;
  quath local_3138;
  quath typed_val_23;
  string local_3118;
  string local_30f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30b8;
  ostringstream local_3098 [8];
  ostringstream ss_e_22;
  undefined1 local_2f20 [8];
  double4 typed_val_22;
  string local_2ee8;
  string local_2ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e88;
  ostringstream local_2e68 [8];
  ostringstream ss_e_21;
  undefined1 local_2cf0 [8];
  double3 typed_val_21;
  string local_2cc0;
  string local_2ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c60;
  ostringstream local_2c40 [8];
  ostringstream ss_e_20;
  undefined1 local_2ac8 [8];
  double2 typed_val_20;
  string local_2aa0;
  string local_2a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a40;
  ostringstream local_2a20 [8];
  ostringstream ss_e_19;
  double local_28a8;
  double typed_val_19;
  string local_2888;
  string local_2868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2828;
  ostringstream local_2808 [8];
  ostringstream ss_e_18;
  undefined1 local_2690 [8];
  float4 typed_val_18;
  string local_2668;
  string local_2648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2608;
  ostringstream local_25e8 [8];
  ostringstream ss_e_17;
  undefined1 local_246c [8];
  float3 typed_val_17;
  string local_2448;
  string local_2428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e8;
  ostringstream local_23c8 [8];
  ostringstream ss_e_16;
  float2 local_2250;
  float2 typed_val_16;
  string local_2230;
  string local_2210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d0;
  ostringstream local_21b0 [8];
  ostringstream ss_e_15;
  float local_2034;
  undefined1 local_2030 [4];
  float typed_val_15;
  string local_2018;
  string local_1ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fb8;
  ostringstream local_1f98 [8];
  ostringstream ss_e_14;
  half4 local_1e20;
  half4 typed_val_14;
  string local_1e00;
  string local_1de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1da0;
  ostringstream local_1d80 [8];
  ostringstream ss_e_13;
  half3 local_1c06;
  undefined1 local_1c00 [2];
  half3 typed_val_13;
  string local_1be8;
  string local_1bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b88;
  ostringstream local_1b68 [8];
  ostringstream ss_e_12;
  half2 local_19ec;
  undefined1 local_19e8 [4];
  half2 typed_val_12;
  string local_19d0;
  string local_19b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1970;
  ostringstream local_1950 [8];
  ostringstream ss_e_11;
  half local_17d2;
  undefined1 local_17d0 [6];
  half typed_val_11;
  string local_17b8;
  string local_1798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1758;
  ostringstream local_1738 [8];
  ostringstream ss_e_10;
  uint64_t local_15c0;
  uint64_t typed_val_10;
  string local_15a0;
  string local_1580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  ostringstream local_1520 [8];
  ostringstream ss_e_9;
  int64_t local_13a8;
  int64_t typed_val_9;
  string local_1388;
  string local_1368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1328;
  ostringstream local_1308 [8];
  ostringstream ss_e_8;
  uint32_t local_118c;
  undefined1 local_1188 [4];
  uint32_t typed_val_8;
  string local_1170;
  string local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  ostringstream local_10f0 [8];
  ostringstream ss_e_7;
  undefined1 local_f78 [8];
  int4 typed_val_7;
  string local_f50;
  string local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  ostringstream local_ed0 [8];
  ostringstream ss_e_6;
  undefined1 local_d54 [8];
  int3 typed_val_6;
  string local_d30;
  string local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd0;
  ostringstream local_cb0 [8];
  ostringstream ss_e_5;
  int2 local_b38;
  int2 typed_val_5;
  string local_b18;
  string local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  ostringstream local_a98 [8];
  ostringstream ss_e_4;
  int local_91c;
  undefined1 local_918 [4];
  int32_t typed_val_4;
  string local_900;
  string local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  ostringstream local_880 [8];
  ostringstream ss_e_3;
  float local_704;
  undefined1 local_700 [4];
  float typed_val_3;
  string local_6e8;
  string local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  ostringstream local_668 [8];
  ostringstream ss_e_2;
  undefined1 local_4f0 [8];
  string typed_val_2;
  string local_4b8;
  string local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ostringstream local_438 [8];
  ostringstream ss_e_1;
  undefined1 local_2c0 [8];
  token typed_val_1;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  ostringstream local_200 [8];
  ostringstream ss_e;
  undefined1 local_88 [8];
  AssetPath typed_val;
  Value val;
  Value *result_local;
  uint32_t type_id_local;
  AsciiParser *this_local;
  
  if (result == (Value *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0057eb69;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    tinyusdz::value::Value::operator=(result,(ValueBlock *)((long)&val.v_.vtable + 7));
    this_local._7_1_ = 1;
    goto LAB_0057eb69;
  }
  tinyusdz::value::Value::Value((Value *)((long)&typed_val.resolved_path_.field_2 + 8));
  uVar2 = tinyusdz::value::TypeTraits<tinyusdz::value::AssetPath>::type_id();
  if (type_id == uVar2) {
    tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_88);
    bVar1 = ReadBasicType(this,(AssetPath *)local_88);
    if (bVar1) {
      tinyusdz::value::Value::Value<tinyusdz::value::AssetPath>
                ((Value *)((long)&typed_val_1.str_.field_2 + 8),(AssetPath *)local_88);
      tinyusdz::value::Value::operator=
                ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                 (Value *)((long)&typed_val_1.str_.field_2 + 8));
      tinyusdz::value::Value::~Value((Value *)((long)&typed_val_1.str_.field_2 + 8));
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_200);
      poVar3 = ::std::operator<<((ostream *)local_200,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6c);
      ::std::operator<<(poVar3," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_260,(value *)(ulong)type_id,tyid);
      ::std::operator+((char *)&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Failed to parse value with requested type `");
      ::std::operator+(&local_220,&local_240,"`");
      poVar3 = ::std::operator<<((ostream *)local_200,(string *)&local_220);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_240);
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_280);
      ::std::__cxx11::string::~string((string *)&local_280);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_200);
    }
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_88);
    if (bVar1) {
LAB_0057eb45:
      tinyusdz::value::Value::operator=
                (result,(Value *)((long)&typed_val.resolved_path_.field_2 + 8));
      this_local._7_1_ = 1;
    }
  }
  else {
    uVar2 = tinyusdz::value::TypeTraits<tinyusdz::Token>::type_id();
    if (type_id == uVar2) {
      Token::Token((Token *)local_2c0);
      bVar1 = ReadBasicType(this,(token *)local_2c0);
      if (bVar1) {
        tinyusdz::value::Value::Value<tinyusdz::Token>
                  ((Value *)((long)&typed_val_2.field_2 + 8),(Token *)local_2c0);
        tinyusdz::value::Value::operator=
                  ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                   (Value *)((long)&typed_val_2.field_2 + 8));
        tinyusdz::value::Value::~Value((Value *)((long)&typed_val_2.field_2 + 8));
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_438);
        poVar3 = ::std::operator<<((ostream *)local_438,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6d);
        ::std::operator<<(poVar3," ");
        tinyusdz::value::GetTypeName_abi_cxx11_(&local_498,(value *)(ulong)type_id,tyid_00);
        ::std::operator+((char *)&local_478,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Failed to parse value with requested type `");
        ::std::operator+(&local_458,&local_478,"`");
        poVar3 = ::std::operator<<((ostream *)local_438,(string *)&local_458);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)&local_458);
        ::std::__cxx11::string::~string((string *)&local_478);
        ::std::__cxx11::string::~string((string *)&local_498);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_4b8);
        ::std::__cxx11::string::~string((string *)&local_4b8);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_438);
      }
      Token::~Token((Token *)local_2c0);
      if (bVar1) goto LAB_0057eb45;
    }
    else {
      uVar2 = tinyusdz::value::
              TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::type_id();
      if (type_id == uVar2) {
        ::std::__cxx11::string::string((string *)local_4f0);
        bVar1 = ReadBasicType(this,(string *)local_4f0);
        if (bVar1) {
          tinyusdz::value::Value::Value<std::__cxx11::string>
                    ((Value *)local_700,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0)
          ;
          tinyusdz::value::Value::operator=
                    ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),(Value *)local_700);
          tinyusdz::value::Value::~Value((Value *)local_700);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_668);
          poVar3 = ::std::operator<<((ostream *)local_668,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6e);
          ::std::operator<<(poVar3," ");
          tinyusdz::value::GetTypeName_abi_cxx11_(&local_6c8,(value *)(ulong)type_id,tyid_01);
          ::std::operator+((char *)&local_6a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Failed to parse value with requested type `");
          ::std::operator+(&local_688,&local_6a8,"`");
          poVar3 = ::std::operator<<((ostream *)local_668,(string *)&local_688);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)&local_688);
          ::std::__cxx11::string::~string((string *)&local_6a8);
          ::std::__cxx11::string::~string((string *)&local_6c8);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_6e8);
          ::std::__cxx11::string::~string((string *)&local_6e8);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_668);
        }
        ::std::__cxx11::string::~string((string *)local_4f0);
        if (bVar1) goto LAB_0057eb45;
      }
      else {
        uVar2 = tinyusdz::value::TypeTraits<float>::type_id();
        if (type_id == uVar2) {
          bVar1 = ReadBasicType(this,&local_704);
          if (bVar1) {
            tinyusdz::value::Value::Value<float>((Value *)local_918,&local_704);
            tinyusdz::value::Value::operator=
                      ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),(Value *)local_918);
            tinyusdz::value::Value::~Value((Value *)local_918);
            goto LAB_0057eb45;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_880);
          poVar3 = ::std::operator<<((ostream *)local_880,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6f);
          ::std::operator<<(poVar3," ");
          tinyusdz::value::GetTypeName_abi_cxx11_(&local_8e0,(value *)(ulong)type_id,tyid_02);
          ::std::operator+((char *)&local_8c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Failed to parse value with requested type `");
          ::std::operator+(&local_8a0,&local_8c0,"`");
          poVar3 = ::std::operator<<((ostream *)local_880,(string *)&local_8a0);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)&local_8a0);
          ::std::__cxx11::string::~string((string *)&local_8c0);
          ::std::__cxx11::string::~string((string *)&local_8e0);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_900);
          ::std::__cxx11::string::~string((string *)&local_900);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_880);
        }
        else {
          uVar2 = tinyusdz::value::TypeTraits<int>::type_id();
          if (type_id == uVar2) {
            bVar1 = ReadBasicType(this,&local_91c);
            if (bVar1) {
              tinyusdz::value::Value::Value<int>((Value *)&typed_val_5,&local_91c);
              tinyusdz::value::Value::operator=
                        ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                         (Value *)&typed_val_5);
              tinyusdz::value::Value::~Value((Value *)&typed_val_5);
              goto LAB_0057eb45;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_a98);
            poVar3 = ::std::operator<<((ostream *)local_a98,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x70);
            ::std::operator<<(poVar3," ");
            tinyusdz::value::GetTypeName_abi_cxx11_(&local_af8,(value *)(ulong)type_id,tyid_03);
            ::std::operator+((char *)&local_ad8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Failed to parse value with requested type `");
            ::std::operator+(&local_ab8,&local_ad8,"`");
            poVar3 = ::std::operator<<((ostream *)local_a98,(string *)&local_ab8);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)&local_ab8);
            ::std::__cxx11::string::~string((string *)&local_ad8);
            ::std::__cxx11::string::~string((string *)&local_af8);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_b18);
            ::std::__cxx11::string::~string((string *)&local_b18);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_a98);
          }
          else {
            uVar2 = tinyusdz::value::TypeTraits<std::array<int,_2UL>_>::type_id();
            if (type_id == uVar2) {
              bVar1 = ReadBasicType(this,&local_b38);
              if (bVar1) {
                tinyusdz::value::Value::Value<std::array<int,2ul>>
                          ((Value *)(typed_val_6._M_elems + 1),&local_b38);
                tinyusdz::value::Value::operator=
                          ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                           (Value *)(typed_val_6._M_elems + 1));
                tinyusdz::value::Value::~Value((Value *)(typed_val_6._M_elems + 1));
                goto LAB_0057eb45;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_cb0);
              poVar3 = ::std::operator<<((ostream *)local_cb0,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x71);
              ::std::operator<<(poVar3," ");
              tinyusdz::value::GetTypeName_abi_cxx11_(&local_d10,(value *)(ulong)type_id,tyid_04);
              ::std::operator+((char *)&local_cf0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to parse value with requested type `");
              ::std::operator+(&local_cd0,&local_cf0,"`");
              poVar3 = ::std::operator<<((ostream *)local_cb0,(string *)&local_cd0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)&local_cd0);
              ::std::__cxx11::string::~string((string *)&local_cf0);
              ::std::__cxx11::string::~string((string *)&local_d10);
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_d30);
              ::std::__cxx11::string::~string((string *)&local_d30);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_cb0);
            }
            else {
              uVar2 = tinyusdz::value::TypeTraits<std::array<int,_3UL>_>::type_id();
              if (type_id == uVar2) {
                bVar1 = ReadBasicType(this,(int3 *)local_d54);
                if (bVar1) {
                  tinyusdz::value::Value::Value<std::array<int,3ul>>
                            ((Value *)(typed_val_7._M_elems + 2),(array<int,_3UL> *)local_d54);
                  tinyusdz::value::Value::operator=
                            ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                             (Value *)(typed_val_7._M_elems + 2));
                  tinyusdz::value::Value::~Value((Value *)(typed_val_7._M_elems + 2));
                  goto LAB_0057eb45;
                }
                ::std::__cxx11::ostringstream::ostringstream(local_ed0);
                poVar3 = ::std::operator<<((ostream *)local_ed0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x72);
                ::std::operator<<(poVar3," ");
                tinyusdz::value::GetTypeName_abi_cxx11_(&local_f30,(value *)(ulong)type_id,tyid_05);
                ::std::operator+((char *)&local_f10,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Failed to parse value with requested type `");
                ::std::operator+(&local_ef0,&local_f10,"`");
                poVar3 = ::std::operator<<((ostream *)local_ed0,(string *)&local_ef0);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_ef0);
                ::std::__cxx11::string::~string((string *)&local_f10);
                ::std::__cxx11::string::~string((string *)&local_f30);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_f50);
                ::std::__cxx11::string::~string((string *)&local_f50);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_ed0);
              }
              else {
                uVar2 = tinyusdz::value::TypeTraits<std::array<int,_4UL>_>::type_id();
                if (type_id == uVar2) {
                  bVar1 = ReadBasicType(this,(int4 *)local_f78);
                  if (bVar1) {
                    tinyusdz::value::Value::Value<std::array<int,4ul>>
                              ((Value *)local_1188,(array<int,_4UL> *)local_f78);
                    tinyusdz::value::Value::operator=
                              ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                               (Value *)local_1188);
                    tinyusdz::value::Value::~Value((Value *)local_1188);
                    goto LAB_0057eb45;
                  }
                  ::std::__cxx11::ostringstream::ostringstream(local_10f0);
                  poVar3 = ::std::operator<<((ostream *)local_10f0,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x73);
                  ::std::operator<<(poVar3," ");
                  tinyusdz::value::GetTypeName_abi_cxx11_
                            (&local_1150,(value *)(ulong)type_id,tyid_06);
                  ::std::operator+((char *)&local_1130,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Failed to parse value with requested type `");
                  ::std::operator+(&local_1110,&local_1130,"`");
                  poVar3 = ::std::operator<<((ostream *)local_10f0,(string *)&local_1110);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)&local_1110);
                  ::std::__cxx11::string::~string((string *)&local_1130);
                  ::std::__cxx11::string::~string((string *)&local_1150);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_1170);
                  ::std::__cxx11::string::~string((string *)&local_1170);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_10f0);
                }
                else {
                  uVar2 = tinyusdz::value::TypeTraits<unsigned_int>::type_id();
                  if (type_id == uVar2) {
                    bVar1 = ReadBasicType(this,&local_118c);
                    if (bVar1) {
                      tinyusdz::value::Value::Value<unsigned_int>((Value *)&typed_val_9,&local_118c)
                      ;
                      tinyusdz::value::Value::operator=
                                ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                 (Value *)&typed_val_9);
                      tinyusdz::value::Value::~Value((Value *)&typed_val_9);
                      goto LAB_0057eb45;
                    }
                    ::std::__cxx11::ostringstream::ostringstream(local_1308);
                    poVar3 = ::std::operator<<((ostream *)local_1308,"[error]");
                    poVar3 = ::std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                              );
                    poVar3 = ::std::operator<<(poVar3,":");
                    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                    poVar3 = ::std::operator<<(poVar3,"():");
                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x74);
                    ::std::operator<<(poVar3," ");
                    tinyusdz::value::GetTypeName_abi_cxx11_
                              (&local_1368,(value *)(ulong)type_id,tyid_07);
                    ::std::operator+((char *)&local_1348,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)"Failed to parse value with requested type `");
                    ::std::operator+(&local_1328,&local_1348,"`");
                    poVar3 = ::std::operator<<((ostream *)local_1308,(string *)&local_1328);
                    ::std::operator<<(poVar3,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1328);
                    ::std::__cxx11::string::~string((string *)&local_1348);
                    ::std::__cxx11::string::~string((string *)&local_1368);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_1388);
                    ::std::__cxx11::string::~string((string *)&local_1388);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1308);
                  }
                  else {
                    uVar2 = tinyusdz::value::TypeTraits<long>::type_id();
                    if (type_id == uVar2) {
                      bVar1 = ReadBasicType(this,&local_13a8);
                      if (bVar1) {
                        tinyusdz::value::Value::Value<long>((Value *)&typed_val_10,&local_13a8);
                        tinyusdz::value::Value::operator=
                                  ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                   (Value *)&typed_val_10);
                        tinyusdz::value::Value::~Value((Value *)&typed_val_10);
                        goto LAB_0057eb45;
                      }
                      ::std::__cxx11::ostringstream::ostringstream(local_1520);
                      poVar3 = ::std::operator<<((ostream *)local_1520,"[error]");
                      poVar3 = ::std::operator<<(poVar3,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                );
                      poVar3 = ::std::operator<<(poVar3,":");
                      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                      poVar3 = ::std::operator<<(poVar3,"():");
                      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x75);
                      ::std::operator<<(poVar3," ");
                      tinyusdz::value::GetTypeName_abi_cxx11_
                                (&local_1580,(value *)(ulong)type_id,tyid_08);
                      ::std::operator+((char *)&local_1560,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"Failed to parse value with requested type `");
                      ::std::operator+(&local_1540,&local_1560,"`");
                      poVar3 = ::std::operator<<((ostream *)local_1520,(string *)&local_1540);
                      ::std::operator<<(poVar3,"\n");
                      ::std::__cxx11::string::~string((string *)&local_1540);
                      ::std::__cxx11::string::~string((string *)&local_1560);
                      ::std::__cxx11::string::~string((string *)&local_1580);
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,&local_15a0);
                      ::std::__cxx11::string::~string((string *)&local_15a0);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1520);
                    }
                    else {
                      uVar2 = tinyusdz::value::TypeTraits<unsigned_long>::type_id();
                      if (type_id == uVar2) {
                        bVar1 = ReadBasicType(this,&local_15c0);
                        if (bVar1) {
                          tinyusdz::value::Value::Value<unsigned_long>
                                    ((Value *)local_17d0,&local_15c0);
                          tinyusdz::value::Value::operator=
                                    ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                     (Value *)local_17d0);
                          tinyusdz::value::Value::~Value((Value *)local_17d0);
                          goto LAB_0057eb45;
                        }
                        ::std::__cxx11::ostringstream::ostringstream(local_1738);
                        poVar3 = ::std::operator<<((ostream *)local_1738,"[error]");
                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                        poVar3 = ::std::operator<<(poVar3,":");
                        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                        poVar3 = ::std::operator<<(poVar3,"():");
                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x76);
                        ::std::operator<<(poVar3," ");
                        tinyusdz::value::GetTypeName_abi_cxx11_
                                  (&local_1798,(value *)(ulong)type_id,tyid_09);
                        ::std::operator+((char *)&local_1778,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"Failed to parse value with requested type `");
                        ::std::operator+(&local_1758,&local_1778,"`");
                        poVar3 = ::std::operator<<((ostream *)local_1738,(string *)&local_1758);
                        ::std::operator<<(poVar3,"\n");
                        ::std::__cxx11::string::~string((string *)&local_1758);
                        ::std::__cxx11::string::~string((string *)&local_1778);
                        ::std::__cxx11::string::~string((string *)&local_1798);
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_17b8);
                        ::std::__cxx11::string::~string((string *)&local_17b8);
                        this_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1738);
                      }
                      else {
                        uVar2 = tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_id();
                        if (type_id == uVar2) {
                          bVar1 = ReadBasicType(this,&local_17d2);
                          if (bVar1) {
                            tinyusdz::value::Value::Value<tinyusdz::value::half>
                                      ((Value *)local_19e8,&local_17d2);
                            tinyusdz::value::Value::operator=
                                      ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                       (Value *)local_19e8);
                            tinyusdz::value::Value::~Value((Value *)local_19e8);
                            goto LAB_0057eb45;
                          }
                          ::std::__cxx11::ostringstream::ostringstream(local_1950);
                          poVar3 = ::std::operator<<((ostream *)local_1950,"[error]");
                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                          poVar3 = ::std::operator<<(poVar3,":");
                          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                          poVar3 = ::std::operator<<(poVar3,"():");
                          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x77);
                          ::std::operator<<(poVar3," ");
                          tinyusdz::value::GetTypeName_abi_cxx11_
                                    (&local_19b0,(value *)(ulong)type_id,tyid_10);
                          ::std::operator+((char *)&local_1990,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)"Failed to parse value with requested type `");
                          ::std::operator+(&local_1970,&local_1990,"`");
                          poVar3 = ::std::operator<<((ostream *)local_1950,(string *)&local_1970);
                          ::std::operator<<(poVar3,"\n");
                          ::std::__cxx11::string::~string((string *)&local_1970);
                          ::std::__cxx11::string::~string((string *)&local_1990);
                          ::std::__cxx11::string::~string((string *)&local_19b0);
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_19d0);
                          ::std::__cxx11::string::~string((string *)&local_19d0);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1950);
                        }
                        else {
                          uVar2 = tinyusdz::value::
                                  TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
                          if (type_id == uVar2) {
                            bVar1 = ReadBasicType(this,&local_19ec);
                            if (bVar1) {
                              tinyusdz::value::Value::Value<std::array<tinyusdz::value::half,2ul>>
                                        ((Value *)local_1c00,&local_19ec);
                              tinyusdz::value::Value::operator=
                                        ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                         (Value *)local_1c00);
                              tinyusdz::value::Value::~Value((Value *)local_1c00);
                              goto LAB_0057eb45;
                            }
                            ::std::__cxx11::ostringstream::ostringstream(local_1b68);
                            poVar3 = ::std::operator<<((ostream *)local_1b68,"[error]");
                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                            poVar3 = ::std::operator<<(poVar3,":");
                            poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                            poVar3 = ::std::operator<<(poVar3,"():");
                            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x78);
                            ::std::operator<<(poVar3," ");
                            tinyusdz::value::GetTypeName_abi_cxx11_
                                      (&local_1bc8,(value *)(ulong)type_id,tyid_11);
                            ::std::operator+((char *)&local_1ba8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)"Failed to parse value with requested type `");
                            ::std::operator+(&local_1b88,&local_1ba8,"`");
                            poVar3 = ::std::operator<<((ostream *)local_1b68,(string *)&local_1b88);
                            ::std::operator<<(poVar3,"\n");
                            ::std::__cxx11::string::~string((string *)&local_1b88);
                            ::std::__cxx11::string::~string((string *)&local_1ba8);
                            ::std::__cxx11::string::~string((string *)&local_1bc8);
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,&local_1be8);
                            ::std::__cxx11::string::~string((string *)&local_1be8);
                            this_local._7_1_ = 0;
                            ::std::__cxx11::ostringstream::~ostringstream(local_1b68);
                          }
                          else {
                            uVar2 = tinyusdz::value::
                                    TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
                            if (type_id == uVar2) {
                              bVar1 = ReadBasicType(this,&local_1c06);
                              if (bVar1) {
                                tinyusdz::value::Value::Value<std::array<tinyusdz::value::half,3ul>>
                                          ((Value *)&typed_val_14,&local_1c06);
                                tinyusdz::value::Value::operator=
                                          ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                           (Value *)&typed_val_14);
                                tinyusdz::value::Value::~Value((Value *)&typed_val_14);
                                goto LAB_0057eb45;
                              }
                              ::std::__cxx11::ostringstream::ostringstream(local_1d80);
                              poVar3 = ::std::operator<<((ostream *)local_1d80,"[error]");
                              poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                              poVar3 = ::std::operator<<(poVar3,":");
                              poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                              poVar3 = ::std::operator<<(poVar3,"():");
                              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x79);
                              ::std::operator<<(poVar3," ");
                              tinyusdz::value::GetTypeName_abi_cxx11_
                                        (&local_1de0,(value *)(ulong)type_id,tyid_12);
                              ::std::operator+((char *)&local_1dc0,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)"Failed to parse value with requested type `");
                              ::std::operator+(&local_1da0,&local_1dc0,"`");
                              poVar3 = ::std::operator<<((ostream *)local_1d80,(string *)&local_1da0
                                                        );
                              ::std::operator<<(poVar3,"\n");
                              ::std::__cxx11::string::~string((string *)&local_1da0);
                              ::std::__cxx11::string::~string((string *)&local_1dc0);
                              ::std::__cxx11::string::~string((string *)&local_1de0);
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,&local_1e00);
                              ::std::__cxx11::string::~string((string *)&local_1e00);
                              this_local._7_1_ = 0;
                              ::std::__cxx11::ostringstream::~ostringstream(local_1d80);
                            }
                            else {
                              uVar2 = tinyusdz::value::
                                      TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id()
                              ;
                              if (type_id == uVar2) {
                                bVar1 = ReadBasicType(this,&local_1e20);
                                if (bVar1) {
                                  tinyusdz::value::Value::
                                  Value<std::array<tinyusdz::value::half,4ul>>
                                            ((Value *)local_2030,&local_1e20);
                                  tinyusdz::value::Value::operator=
                                            ((Value *)((long)&typed_val.resolved_path_.field_2 + 8),
                                             (Value *)local_2030);
                                  tinyusdz::value::Value::~Value((Value *)local_2030);
                                  goto LAB_0057eb45;
                                }
                                ::std::__cxx11::ostringstream::ostringstream(local_1f98);
                                poVar3 = ::std::operator<<((ostream *)local_1f98,"[error]");
                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                poVar3 = ::std::operator<<(poVar3,":");
                                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                poVar3 = ::std::operator<<(poVar3,"():");
                                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7a);
                                ::std::operator<<(poVar3," ");
                                tinyusdz::value::GetTypeName_abi_cxx11_
                                          (&local_1ff8,(value *)(ulong)type_id,tyid_13);
                                ::std::operator+((char *)&local_1fd8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                ::std::operator+(&local_1fb8,&local_1fd8,"`");
                                poVar3 = ::std::operator<<((ostream *)local_1f98,
                                                           (string *)&local_1fb8);
                                ::std::operator<<(poVar3,"\n");
                                ::std::__cxx11::string::~string((string *)&local_1fb8);
                                ::std::__cxx11::string::~string((string *)&local_1fd8);
                                ::std::__cxx11::string::~string((string *)&local_1ff8);
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,&local_2018);
                                ::std::__cxx11::string::~string((string *)&local_2018);
                                this_local._7_1_ = 0;
                                ::std::__cxx11::ostringstream::~ostringstream(local_1f98);
                              }
                              else {
                                uVar2 = tinyusdz::value::TypeTraits<float>::type_id();
                                if (type_id == uVar2) {
                                  bVar1 = ReadBasicType(this,&local_2034);
                                  if (bVar1) {
                                    tinyusdz::value::Value::Value<float>
                                              ((Value *)&typed_val_16,&local_2034);
                                    tinyusdz::value::Value::operator=
                                              ((Value *)((long)&typed_val.resolved_path_.field_2 + 8
                                                        ),(Value *)&typed_val_16);
                                    tinyusdz::value::Value::~Value((Value *)&typed_val_16);
                                    goto LAB_0057eb45;
                                  }
                                  ::std::__cxx11::ostringstream::ostringstream(local_21b0);
                                  poVar3 = ::std::operator<<((ostream *)local_21b0,"[error]");
                                  poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                  poVar3 = ::std::operator<<(poVar3,":");
                                  poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                  poVar3 = ::std::operator<<(poVar3,"():");
                                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7b);
                                  ::std::operator<<(poVar3," ");
                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                            (&local_2210,(value *)(ulong)type_id,tyid_14);
                                  ::std::operator+((char *)&local_21f0,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                  ::std::operator+(&local_21d0,&local_21f0,"`");
                                  poVar3 = ::std::operator<<((ostream *)local_21b0,
                                                             (string *)&local_21d0);
                                  ::std::operator<<(poVar3,"\n");
                                  ::std::__cxx11::string::~string((string *)&local_21d0);
                                  ::std::__cxx11::string::~string((string *)&local_21f0);
                                  ::std::__cxx11::string::~string((string *)&local_2210);
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,&local_2230);
                                  ::std::__cxx11::string::~string((string *)&local_2230);
                                  this_local._7_1_ = 0;
                                  ::std::__cxx11::ostringstream::~ostringstream(local_21b0);
                                }
                                else {
                                  uVar2 = tinyusdz::value::TypeTraits<std::array<float,_2UL>_>::
                                          type_id();
                                  if (type_id == uVar2) {
                                    bVar1 = ReadBasicType(this,&local_2250);
                                    if (bVar1) {
                                      tinyusdz::value::Value::Value<std::array<float,2ul>>
                                                ((Value *)(typed_val_17._M_elems + 1),&local_2250);
                                      tinyusdz::value::Value::operator=
                                                ((Value *)((long)&typed_val.resolved_path_.field_2 +
                                                          8),(Value *)(typed_val_17._M_elems + 1));
                                      tinyusdz::value::Value::~Value
                                                ((Value *)(typed_val_17._M_elems + 1));
                                      goto LAB_0057eb45;
                                    }
                                    ::std::__cxx11::ostringstream::ostringstream(local_23c8);
                                    poVar3 = ::std::operator<<((ostream *)local_23c8,"[error]");
                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                    poVar3 = ::std::operator<<(poVar3,":");
                                    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                    poVar3 = ::std::operator<<(poVar3,"():");
                                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7c);
                                    ::std::operator<<(poVar3," ");
                                    tinyusdz::value::GetTypeName_abi_cxx11_
                                              (&local_2428,(value *)(ulong)type_id,tyid_15);
                                    ::std::operator+((char *)&local_2408,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                    ::std::operator+(&local_23e8,&local_2408,"`");
                                    poVar3 = ::std::operator<<((ostream *)local_23c8,
                                                               (string *)&local_23e8);
                                    ::std::operator<<(poVar3,"\n");
                                    ::std::__cxx11::string::~string((string *)&local_23e8);
                                    ::std::__cxx11::string::~string((string *)&local_2408);
                                    ::std::__cxx11::string::~string((string *)&local_2428);
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,&local_2448);
                                    ::std::__cxx11::string::~string((string *)&local_2448);
                                    this_local._7_1_ = 0;
                                    ::std::__cxx11::ostringstream::~ostringstream(local_23c8);
                                  }
                                  else {
                                    uVar2 = tinyusdz::value::TypeTraits<std::array<float,_3UL>_>::
                                            type_id();
                                    if (type_id == uVar2) {
                                      bVar1 = ReadBasicType(this,(float3 *)local_246c);
                                      if (bVar1) {
                                        tinyusdz::value::Value::Value<std::array<float,3ul>>
                                                  ((Value *)(typed_val_18._M_elems + 2),
                                                   (array<float,_3UL> *)local_246c);
                                        tinyusdz::value::Value::operator=
                                                  ((Value *)((long)&typed_val.resolved_path_.field_2
                                                            + 8),
                                                   (Value *)(typed_val_18._M_elems + 2));
                                        tinyusdz::value::Value::~Value
                                                  ((Value *)(typed_val_18._M_elems + 2));
                                        goto LAB_0057eb45;
                                      }
                                      ::std::__cxx11::ostringstream::ostringstream(local_25e8);
                                      poVar3 = ::std::operator<<((ostream *)local_25e8,"[error]");
                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                      poVar3 = ::std::operator<<(poVar3,":");
                                      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                      poVar3 = ::std::operator<<(poVar3,"():");
                                      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7d);
                                      ::std::operator<<(poVar3," ");
                                      tinyusdz::value::GetTypeName_abi_cxx11_
                                                (&local_2648,(value *)(ulong)type_id,tyid_16);
                                      ::std::operator+((char *)&local_2628,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                      ::std::operator+(&local_2608,&local_2628,"`");
                                      poVar3 = ::std::operator<<((ostream *)local_25e8,
                                                                 (string *)&local_2608);
                                      ::std::operator<<(poVar3,"\n");
                                      ::std::__cxx11::string::~string((string *)&local_2608);
                                      ::std::__cxx11::string::~string((string *)&local_2628);
                                      ::std::__cxx11::string::~string((string *)&local_2648);
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,&local_2668);
                                      ::std::__cxx11::string::~string((string *)&local_2668);
                                      this_local._7_1_ = 0;
                                      ::std::__cxx11::ostringstream::~ostringstream(local_25e8);
                                    }
                                    else {
                                      uVar2 = tinyusdz::value::TypeTraits<std::array<float,_4UL>_>::
                                              type_id();
                                      if (type_id == uVar2) {
                                        bVar1 = ReadBasicType(this,(float4 *)local_2690);
                                        if (bVar1) {
                                          tinyusdz::value::Value::Value<std::array<float,4ul>>
                                                    ((Value *)&typed_val_19,
                                                     (array<float,_4UL> *)local_2690);
                                          tinyusdz::value::Value::operator=
                                                    ((Value *)((long)&typed_val.resolved_path_.
                                                                      field_2 + 8),
                                                     (Value *)&typed_val_19);
                                          tinyusdz::value::Value::~Value((Value *)&typed_val_19);
                                          goto LAB_0057eb45;
                                        }
                                        ::std::__cxx11::ostringstream::ostringstream(local_2808);
                                        poVar3 = ::std::operator<<((ostream *)local_2808,"[error]");
                                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                        poVar3 = ::std::operator<<(poVar3,":");
                                        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                        poVar3 = ::std::operator<<(poVar3,"():");
                                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7e);
                                        ::std::operator<<(poVar3," ");
                                        tinyusdz::value::GetTypeName_abi_cxx11_
                                                  (&local_2868,(value *)(ulong)type_id,tyid_17);
                                        ::std::operator+((char *)&local_2848,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                        ::std::operator+(&local_2828,&local_2848,"`");
                                        poVar3 = ::std::operator<<((ostream *)local_2808,
                                                                   (string *)&local_2828);
                                        ::std::operator<<(poVar3,"\n");
                                        ::std::__cxx11::string::~string((string *)&local_2828);
                                        ::std::__cxx11::string::~string((string *)&local_2848);
                                        ::std::__cxx11::string::~string((string *)&local_2868);
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,&local_2888);
                                        ::std::__cxx11::string::~string((string *)&local_2888);
                                        this_local._7_1_ = 0;
                                        ::std::__cxx11::ostringstream::~ostringstream(local_2808);
                                      }
                                      else {
                                        uVar2 = tinyusdz::value::TypeTraits<double>::type_id();
                                        if (type_id == uVar2) {
                                          bVar1 = ReadBasicType(this,&local_28a8);
                                          if (bVar1) {
                                            tinyusdz::value::Value::Value<double>
                                                      ((Value *)(typed_val_20._M_elems + 1),
                                                       &local_28a8);
                                            tinyusdz::value::Value::operator=
                                                      ((Value *)((long)&typed_val.resolved_path_.
                                                                        field_2 + 8),
                                                       (Value *)(typed_val_20._M_elems + 1));
                                            tinyusdz::value::Value::~Value
                                                      ((Value *)(typed_val_20._M_elems + 1));
                                            goto LAB_0057eb45;
                                          }
                                          ::std::__cxx11::ostringstream::ostringstream(local_2a20);
                                          poVar3 = ::std::operator<<((ostream *)local_2a20,"[error]"
                                                                    );
                                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                          poVar3 = ::std::operator<<(poVar3,":");
                                          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue");
                                          poVar3 = ::std::operator<<(poVar3,"():");
                                          poVar3 = (ostream *)
                                                   ::std::ostream::operator<<(poVar3,0x7f);
                                          ::std::operator<<(poVar3," ");
                                          tinyusdz::value::GetTypeName_abi_cxx11_
                                                    (&local_2a80,(value *)(ulong)type_id,tyid_18);
                                          ::std::operator+((char *)&local_2a60,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                          ::std::operator+(&local_2a40,&local_2a60,"`");
                                          poVar3 = ::std::operator<<((ostream *)local_2a20,
                                                                     (string *)&local_2a40);
                                          ::std::operator<<(poVar3,"\n");
                                          ::std::__cxx11::string::~string((string *)&local_2a40);
                                          ::std::__cxx11::string::~string((string *)&local_2a60);
                                          ::std::__cxx11::string::~string((string *)&local_2a80);
                                          ::std::__cxx11::ostringstream::str();
                                          PushError(this,&local_2aa0);
                                          ::std::__cxx11::string::~string((string *)&local_2aa0);
                                          this_local._7_1_ = 0;
                                          ::std::__cxx11::ostringstream::~ostringstream(local_2a20);
                                        }
                                        else {
                                          uVar2 = tinyusdz::value::
                                                  TypeTraits<std::array<double,_2UL>_>::type_id();
                                          if (type_id == uVar2) {
                                            bVar1 = ReadBasicType(this,(double2 *)local_2ac8);
                                            if (bVar1) {
                                              tinyusdz::value::Value::Value<std::array<double,2ul>>
                                                        ((Value *)(typed_val_21._M_elems + 2),
                                                         (array<double,_2UL> *)local_2ac8);
                                              tinyusdz::value::Value::operator=
                                                        ((Value *)((long)&typed_val.resolved_path_.
                                                                          field_2 + 8),
                                                         (Value *)(typed_val_21._M_elems + 2));
                                              tinyusdz::value::Value::~Value
                                                        ((Value *)(typed_val_21._M_elems + 2));
                                              goto LAB_0057eb45;
                                            }
                                            ::std::__cxx11::ostringstream::ostringstream(local_2c40)
                                            ;
                                            poVar3 = ::std::operator<<((ostream *)local_2c40,
                                                                       "[error]");
                                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                            poVar3 = ::std::operator<<(poVar3,":");
                                            poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValue"
                                                                      );
                                            poVar3 = ::std::operator<<(poVar3,"():");
                                            poVar3 = (ostream *)
                                                     ::std::ostream::operator<<(poVar3,0x80);
                                            ::std::operator<<(poVar3," ");
                                            tinyusdz::value::GetTypeName_abi_cxx11_
                                                      (&local_2ca0,(value *)(ulong)type_id,tyid_19);
                                            ::std::operator+((char *)&local_2c80,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                            ::std::operator+(&local_2c60,&local_2c80,"`");
                                            poVar3 = ::std::operator<<((ostream *)local_2c40,
                                                                       (string *)&local_2c60);
                                            ::std::operator<<(poVar3,"\n");
                                            ::std::__cxx11::string::~string((string *)&local_2c60);
                                            ::std::__cxx11::string::~string((string *)&local_2c80);
                                            ::std::__cxx11::string::~string((string *)&local_2ca0);
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,&local_2cc0);
                                            ::std::__cxx11::string::~string((string *)&local_2cc0);
                                            this_local._7_1_ = 0;
                                            ::std::__cxx11::ostringstream::~ostringstream
                                                      (local_2c40);
                                          }
                                          else {
                                            uVar2 = tinyusdz::value::
                                                    TypeTraits<std::array<double,_3UL>_>::type_id();
                                            if (type_id == uVar2) {
                                              bVar1 = ReadBasicType(this,(double3 *)local_2cf0);
                                              if (bVar1) {
                                                tinyusdz::value::Value::
                                                Value<std::array<double,3ul>>
                                                          ((Value *)(typed_val_22._M_elems + 3),
                                                           (array<double,_3UL> *)local_2cf0);
                                                tinyusdz::value::Value::operator=
                                                          ((Value *)((long)&typed_val.resolved_path_
                                                                            .field_2 + 8),
                                                           (Value *)(typed_val_22._M_elems + 3));
                                                tinyusdz::value::Value::~Value
                                                          ((Value *)(typed_val_22._M_elems + 3));
                                                goto LAB_0057eb45;
                                              }
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (local_2e68);
                                              poVar3 = ::std::operator<<((ostream *)local_2e68,
                                                                         "[error]");
                                              poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                              poVar3 = ::std::operator<<(poVar3,":");
                                              poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                              poVar3 = ::std::operator<<(poVar3,"():");
                                              poVar3 = (ostream *)
                                                       ::std::ostream::operator<<(poVar3,0x81);
                                              ::std::operator<<(poVar3," ");
                                              tinyusdz::value::GetTypeName_abi_cxx11_
                                                        (&local_2ec8,(value *)(ulong)type_id,tyid_20
                                                        );
                                              ::std::operator+((char *)&local_2ea8,
                                                               (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                              ::std::operator+(&local_2e88,&local_2ea8,"`");
                                              poVar3 = ::std::operator<<((ostream *)local_2e68,
                                                                         (string *)&local_2e88);
                                              ::std::operator<<(poVar3,"\n");
                                              ::std::__cxx11::string::~string((string *)&local_2e88)
                                              ;
                                              ::std::__cxx11::string::~string((string *)&local_2ea8)
                                              ;
                                              ::std::__cxx11::string::~string((string *)&local_2ec8)
                                              ;
                                              ::std::__cxx11::ostringstream::str();
                                              PushError(this,&local_2ee8);
                                              ::std::__cxx11::string::~string((string *)&local_2ee8)
                                              ;
                                              this_local._7_1_ = 0;
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (local_2e68);
                                            }
                                            else {
                                              uVar2 = tinyusdz::value::
                                                      TypeTraits<std::array<double,_4UL>_>::type_id
                                                                ();
                                              if (type_id == uVar2) {
                                                bVar1 = ReadBasicType(this,(double4 *)local_2f20);
                                                if (bVar1) {
                                                  tinyusdz::value::Value::
                                                  Value<std::array<double,4ul>>
                                                            ((Value *)&typed_val_23,
                                                             (array<double,_4UL> *)local_2f20);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)((long)&typed_val.
                                                                              resolved_path_.field_2
                                                                      + 8),(Value *)&typed_val_23);
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_23);
                                                  goto LAB_0057eb45;
                                                }
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_3098);
                                                poVar3 = ::std::operator<<((ostream *)local_3098,
                                                                           "[error]");
                                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                poVar3 = ::std::operator<<(poVar3,":");
                                                poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                poVar3 = ::std::operator<<(poVar3,"():");
                                                poVar3 = (ostream *)
                                                         ::std::ostream::operator<<(poVar3,0x82);
                                                ::std::operator<<(poVar3," ");
                                                tinyusdz::value::GetTypeName_abi_cxx11_
                                                          (&local_30f8,(value *)(ulong)type_id,
                                                           tyid_21);
                                                ::std::operator+((char *)&local_30d8,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                ::std::operator+(&local_30b8,&local_30d8,"`");
                                                poVar3 = ::std::operator<<((ostream *)local_3098,
                                                                           (string *)&local_30b8);
                                                ::std::operator<<(poVar3,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_30b8);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_30d8);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_30f8);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,&local_3118);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_3118);
                                                this_local._7_1_ = 0;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_3098);
                                              }
                                              else {
                                                uVar2 = tinyusdz::value::
                                                        TypeTraits<tinyusdz::value::quath>::type_id
                                                                  ();
                                                if (type_id == uVar2) {
                                                  bVar1 = ReadBasicType(this,&local_3138);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                    Value<tinyusdz::value::quath>
                                                              ((Value *)(typed_val_24.imag._M_elems
                                                                        + 2),&local_3138);
                                                    tinyusdz::value::Value::operator=
                                                              ((Value *)((long)&typed_val.
                                                                                resolved_path_.
                                                                                field_2 + 8),
                                                               (Value *)(typed_val_24.imag._M_elems
                                                                        + 2));
                                                    tinyusdz::value::Value::~Value
                                                              ((Value *)(typed_val_24.imag._M_elems
                                                                        + 2));
                                                    goto LAB_0057eb45;
                                                  }
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            (local_32b0);
                                                  poVar3 = ::std::operator<<((ostream *)local_32b0,
                                                                             "[error]");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x83);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3310,(value *)(ulong)type_id,
                                                             tyid_22);
                                                  ::std::operator+((char *)&local_32f0,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_32d0,&local_32f0,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_32b0,
                                                                             (string *)&local_32d0);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_32d0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_32f0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3310);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3330);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3330);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_32b0);
                                                }
                                                else {
                                                  uVar2 = tinyusdz::value::
                                                          TypeTraits<tinyusdz::value::quatf>::
                                                          type_id();
                                                  if (type_id == uVar2) {
                                                    bVar1 = ReadBasicType(this,(quatf *)local_3358);
                                                    if (bVar1) {
                                                      tinyusdz::value::Value::
                                                      Value<tinyusdz::value::quatf>
                                                                ((Value *)&typed_val_25.real,
                                                                 (quatf *)local_3358);
                                                      tinyusdz::value::Value::operator=
                                                                ((Value *)((long)&typed_val.
                                                                                  resolved_path_.
                                                                                  field_2 + 8),
                                                                 (Value *)&typed_val_25.real);
                                                      tinyusdz::value::Value::~Value
                                                                ((Value *)&typed_val_25.real);
                                                      goto LAB_0057eb45;
                                                    }
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_34d0);
                                                    poVar3 = ::std::operator<<((ostream *)local_34d0
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x84);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3530,(value *)(ulong)type_id,
                                                             tyid_23);
                                                  ::std::operator+((char *)&local_3510,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_34f0,&local_3510,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_34d0,
                                                                             (string *)&local_34f0);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_34f0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3510);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3530);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3550);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3550);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_34d0);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::quatd>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(quatd *)local_3588
                                                                           );
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::quatd>
                                                                  ((Value *)&typed_val_26.g,
                                                                   (quatd *)local_3588);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_26.g);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_26.g);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_3700);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_3700,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x85);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3760,(value *)(ulong)type_id,
                                                             tyid_24);
                                                  ::std::operator+((char *)&local_3740,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_3720,&local_3740,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_3700,
                                                                             (string *)&local_3720);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3720);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3740);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3760);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3780);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3780);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3700);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(color3f *)
                                                                                 local_37a4);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::color3f>
                                                                  ((Value *)&typed_val_27.b,
                                                                   (color3f *)local_37a4);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_27.b);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_27.b);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_3920);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_3920,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x86);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3980,(value *)(ulong)type_id,
                                                             tyid_25);
                                                  ::std::operator+((char *)&local_3960,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_3940,&local_3960,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_3920,
                                                                             (string *)&local_3940);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3940);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3960);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3980);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_39a0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_39a0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3920);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color4f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(color4f *)
                                                                                 local_39c8);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::color4f>
                                                                  ((Value *)&typed_val_28.b,
                                                                   (color4f *)local_39c8);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_28.b);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_28.b);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_3b40);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_3b40,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x87);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3ba0,(value *)(ulong)type_id,
                                                             tyid_26);
                                                  ::std::operator+((char *)&local_3b80,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_3b60,&local_3b80,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_3b40,
                                                                             (string *)&local_3b60);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3b60);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3b80);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3ba0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3bc0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3bc0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3b40);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color3d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(color3d *)
                                                                                 local_3bf0);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::color3d>
                                                                  ((Value *)&typed_val_29.a,
                                                                   (color3d *)local_3bf0);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_29.a);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_29.a);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_3d68);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_3d68,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x88);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3dc8,(value *)(ulong)type_id,
                                                             tyid_27);
                                                  ::std::operator+((char *)&local_3da8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_3d88,&local_3da8,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_3d68,
                                                                             (string *)&local_3d88);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3d88);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3da8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3dc8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3de8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3de8);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3d68);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color4d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(color4d *)
                                                                                 local_3e20);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::color4d>
                                                                  ((Value *)&typed_val_30.y,
                                                                   (color4d *)local_3e20);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_30.y);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_30.y);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_3f98);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_3f98,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x89);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3ff8,(value *)(ulong)type_id,
                                                             tyid_28);
                                                  ::std::operator+((char *)&local_3fd8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_3fb8,&local_3fd8,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_3f98,
                                                                             (string *)&local_3fb8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3fb8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3fd8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3ff8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4018);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4018);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3f98);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::vector3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(vector3f *)
                                                                                 local_403c);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::vector3f>
                                                                  ((Value *)&typed_val_31.y,
                                                                   (vector3f *)local_403c);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_31.y);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_31.y);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_41b8);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_41b8,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8a);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4218,(value *)(ulong)type_id,
                                                             tyid_29);
                                                  ::std::operator+((char *)&local_41f8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_41d8,&local_41f8,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_41b8,
                                                                             (string *)&local_41d8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_41d8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_41f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4218);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4238);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4238);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_41b8);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::normal3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(normal3f *)
                                                                                 local_425c);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::normal3f>
                                                                  ((Value *)&typed_val_32.y,
                                                                   (normal3f *)local_425c);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_32.y);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_32.y);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_43d8);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_43d8,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8b);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4438,(value *)(ulong)type_id,
                                                             tyid_30);
                                                  ::std::operator+((char *)&local_4418,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_43f8,&local_4418,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_43d8,
                                                                             (string *)&local_43f8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_43f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4418);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4438);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4458);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4458);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_43d8);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::point3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(point3f *)
                                                                                 local_447c);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::point3f>
                                                                  ((Value *)&typed_val_33,
                                                                   (point3f *)local_447c);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_33);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_33);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_45f8);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_45f8,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8c);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4658,(value *)(ulong)type_id,
                                                             tyid_31);
                                                  ::std::operator+((char *)&local_4638,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_4618,&local_4638,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_45f8,
                                                                             (string *)&local_4618);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4618);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4638);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4658);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4678);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4678);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_45f8);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::texcoord2f>
                                                            ::type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,&local_4698);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::texcoord2f>
                                                                  ((Value *)&typed_val_34.t,
                                                                   &local_4698);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)&typed_val_34.t);
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)&typed_val_34.t);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_4810);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_4810,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8d);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4870,(value *)(ulong)type_id,
                                                             tyid_32);
                                                  ::std::operator+((char *)&local_4850,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_4830,&local_4850,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_4810,
                                                                             (string *)&local_4830);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4830);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4850);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4870);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4890);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4890);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4810);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::texcoord3f>
                                                            ::type_id();
                                                    if (type_id == uVar2) {
                                                      bVar1 = ReadBasicType(this,(texcoord3f *)
                                                                                 local_48b4);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::texcoord3f>
                                                                  ((Value *)(typed_val_35.m + 1),
                                                                   (texcoord3f *)local_48b4);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_35.m + 1));
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_35.m + 1));
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_4a30);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_4a30,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8e);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4a90,(value *)(ulong)type_id,
                                                             tyid_33);
                                                  ::std::operator+((char *)&local_4a70,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_4a50,&local_4a70,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_4a30,
                                                                             (string *)&local_4a50);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4a50);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4a70);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4a90);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4ab0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4ab0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4a30);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix2f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix2f::matrix2f
                                                                ((matrix2f *)local_4ad8);
                                                      bVar1 = ReadBasicType(this,(matrix2f *)
                                                                                 local_4ad8);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix2f>
                                                                  ((Value *)(typed_val_36.m[2] + 1),
                                                                   (matrix2f *)local_4ad8);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_36.m[2] + 1))
                                                        ;
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_36.m[2] + 1))
                                                        ;
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_4c50);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_4c50,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x8f);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4cb0,(value *)(ulong)type_id,
                                                             tyid_34);
                                                  ::std::operator+((char *)&local_4c90,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_4c70,&local_4c90,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_4c50,
                                                                             (string *)&local_4c70);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4c70);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4c90);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4cb0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4cd0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4cd0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4c50);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix3f::matrix3f
                                                                ((matrix3f *)local_4d0c);
                                                      bVar1 = ReadBasicType(this,(matrix3f *)
                                                                                 local_4d0c);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix3f>
                                                                  ((Value *)(typed_val_37.m[3] + 2),
                                                                   (matrix3f *)local_4d0c);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_37.m[3] + 2))
                                                        ;
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_37.m[3] + 2))
                                                        ;
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_4e88);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_4e88,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x90);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4ee8,(value *)(ulong)type_id,
                                                             tyid_35);
                                                  ::std::operator+((char *)&local_4ec8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_4ea8,&local_4ec8,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_4e88,
                                                                             (string *)&local_4ea8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4ea8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4ec8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4ee8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4f08);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4f08);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4e88);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix4f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix4f::matrix4f
                                                                ((matrix4f *)local_4f60);
                                                      bVar1 = ReadBasicType(this,(matrix4f *)
                                                                                 local_4f60);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix4f>
                                                                  ((Value *)(typed_val_38.m[1] + 1),
                                                                   (matrix4f *)local_4f60);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_38.m[1] + 1))
                                                        ;
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_38.m[1] + 1))
                                                        ;
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_50d8);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_50d8,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x91);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_5138,(value *)(ulong)type_id,
                                                             tyid_36);
                                                  ::std::operator+((char *)&local_5118,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_50f8,&local_5118,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_50d8,
                                                                             (string *)&local_50f8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_50f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5118);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5138);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5158);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5158);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_50d8);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix2d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix2d::matrix2d
                                                                ((matrix2d *)local_5190);
                                                      bVar1 = ReadBasicType(this,(matrix2d *)
                                                                                 local_5190);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix2d>
                                                                  ((Value *)(typed_val_39.m[2] + 2),
                                                                   (matrix2d *)local_5190);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_39.m[2] + 2))
                                                        ;
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_39.m[2] + 2))
                                                        ;
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_5308);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_5308,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x92);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_5368,(value *)(ulong)type_id,
                                                             tyid_37);
                                                  ::std::operator+((char *)&local_5348,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_5328,&local_5348,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_5308,
                                                                             (string *)&local_5328);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5328);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5348);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5368);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5388);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5388);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_5308);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix3d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix3d::matrix3d
                                                                ((matrix3d *)local_53e8);
                                                      bVar1 = ReadBasicType(this,(matrix3d *)
                                                                                 local_53e8);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix3d>
                                                                  ((Value *)(typed_val_40.m[3] + 3),
                                                                   (matrix3d *)local_53e8);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   (Value *)(typed_val_40.m[3] + 3))
                                                        ;
                                                        tinyusdz::value::Value::~Value
                                                                  ((Value *)(typed_val_40.m[3] + 3))
                                                        ;
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_5560);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_5560,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x93);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_55c0,(value *)(ulong)type_id,
                                                             tyid_38);
                                                  ::std::operator+((char *)&local_55a0,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_5580,&local_55a0,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_5560,
                                                                             (string *)&local_5580);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5580);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_55a0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_55c0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_55e0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_55e0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_5560);
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix4d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      tinyusdz::value::matrix4d::matrix4d
                                                                ((matrix4d *)local_5678);
                                                      bVar1 = ReadBasicType(this,(matrix4d *)
                                                                                 local_5678);
                                                      if (bVar1) {
                                                        tinyusdz::value::Value::
                                                        Value<tinyusdz::value::matrix4d>
                                                                  (&local_5888,
                                                                   (matrix4d *)local_5678);
                                                        tinyusdz::value::Value::operator=
                                                                  ((Value *)((long)&typed_val.
                                                                                    resolved_path_.
                                                                                    field_2 + 8),
                                                                   &local_5888);
                                                        tinyusdz::value::Value::~Value(&local_5888);
                                                        goto LAB_0057eb45;
                                                      }
                                                      ::std::__cxx11::ostringstream::ostringstream
                                                                (local_57f0);
                                                      poVar3 = ::std::operator<<((ostream *)
                                                                                 local_57f0,
                                                                                 "[error]");
                                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x94);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_5850,(value *)(ulong)type_id,
                                                             tyid_39);
                                                  ::std::operator+((char *)&local_5830,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(&local_5810,&local_5830,"`");
                                                  poVar3 = ::std::operator<<((ostream *)local_57f0,
                                                                             (string *)&local_5810);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5810);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5830);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5850);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5870);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5870);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_57f0);
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_5a00);
                                                    poVar3 = ::std::operator<<((ostream *)local_5a00
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValue");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0x95);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_5a40,(value *)(ulong)type_id,
                                                             tyid_40);
                                                  ::std::operator+((char *)local_5a20,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)" : TODO: timeSamples type ");
                                                  poVar3 = ::std::operator<<((ostream *)local_5a00,
                                                                             local_5a20);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string(local_5a20);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5a40);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5a60);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5a60);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_5a00);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  tinyusdz::value::Value::~Value((Value *)((long)&typed_val.resolved_path_.field_2 + 8));
LAB_0057eb69:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    __type typed_val; \
    if (!ReadBasicType(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, value::int2)
  PARSE_TYPE(type_id, value::int3)
  PARSE_TYPE(type_id, value::int4)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;
}